

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# were.c
# Opt level: O3

void were_change(monst *mon)

{
  boolean bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  
  uVar2 = mon->data->mflags2;
  if ((uVar2 & 4) == 0) {
    return;
  }
  if ((uVar2 & 8) == 0) {
    uVar2 = mt_random();
    if (((0x8888888 < (uVar2 * -0x11111111 >> 1 | (uint)((uVar2 * -0x11111111 & 1) != 0) << 0x1f))
        && (u.uprops[0x17].intrinsic == 0)) && (u.uprops[0x17].extrinsic == 0)) {
      return;
    }
    new_were(mon);
    return;
  }
  if (u.uprops[0x17].extrinsic != 0 || u.uprops[0x17].intrinsic != 0) {
    return;
  }
  iVar3 = night();
  uVar2 = 0x1e;
  if (flags.moonphase == 4) {
    uVar2 = 3;
  }
  uVar4 = 0x32;
  if (flags.moonphase == 4) {
    uVar4 = 10;
  }
  if (iVar3 != 0) {
    uVar4 = uVar2;
  }
  uVar2 = mt_random();
  if (uVar2 % uVar4 != 0) {
    return;
  }
  new_were(mon);
  if (flags.soundok == '\0') {
    return;
  }
  if (mon->wormno == '\0') {
    if ((viz_array[mon->my][mon->mx] & 2U) == 0) {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00286eb7;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00286eae;
      }
      else {
LAB_00286eae:
        if (ublindf == (obj *)0x0) goto LAB_00286f62;
LAB_00286eb7:
        if (ublindf->oartifact != '\x1d') goto LAB_00286f62;
      }
      if (((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
          (((youmonst.data)->mflags3 & 0x100) == 0)) ||
         (((viz_array[mon->my][mon->mx] & 1U) == 0 || ((mon->data->mflags3 & 0x200) == 0))))
      goto LAB_00286f62;
    }
  }
  else {
    bVar1 = worm_known(level,mon);
    if (bVar1 == '\0') goto LAB_00286f62;
  }
  uVar2 = *(uint *)&mon->field_0x60;
  if ((((uVar2 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) {
    if ((uVar2 & 0x280) != 0) goto LAB_00286f62;
  }
  else if (((uVar2 & 0x280) != 0) || (((youmonst.data)->mflags1 & 0x1000000) == 0))
  goto LAB_00286f62;
  if ((u._1052_1_ & 0x20) == 0) {
    return;
  }
LAB_00286f62:
  if (mon->mnum == 0x17) {
    pcVar5 = "wolf";
  }
  else {
    if (mon->mnum != 0x11) {
      return;
    }
    pcVar5 = "jackal";
  }
  You_hear("a %s howling at the moon.",pcVar5);
  return;
}

Assistant:

void were_change(struct monst *mon)
{
	if (!is_were(mon->data))
	    return;

	if (is_human(mon->data)) {
	    if (!Protection_from_shape_changers &&
		!rn2(night() ? (flags.moonphase == FULL_MOON ?  3 : 30)
			     : (flags.moonphase == FULL_MOON ? 10 : 50))) {
		new_were(mon);		/* change into animal form */
		if (flags.soundok && !canseemon(level, mon)) {
		    const char *howler;

		    switch (mon->mnum) {
		    case PM_WEREWOLF:	howler = "wolf";    break;
		    case PM_WEREJACKAL: howler = "jackal";  break;
		    default:		howler = NULL; break;
		    }
		    if (howler)
			You_hear("a %s howling at the moon.", howler);
		}
	    }
	} else if (!rn2(30) || Protection_from_shape_changers) {
	    new_were(mon);		/* change back into human form */
	}
}